

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
          (Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>_>
  *this_00;
  Stack<std::unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>_>
  *elem;
  long in_RDI;
  Stack<unsigned_int> *in_stack_ffffffffffffffa8;
  DefaultKeepRecycled *in_stack_ffffffffffffffb0;
  DefaultKeepRecycled local_10 [16];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                      *)0x32cd28);
  if (bVar1) {
    self((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x32cd47
        );
    bVar1 = DefaultKeepRecycled::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((bVar1) &&
       ((Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>::memAlive & 1
        ) != 0)) {
      this_00 = (Stack<std::unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>_>
                 *)(in_RDI + 8);
      self((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           0x32cd8c);
      DefaultReset::operator()((DefaultReset *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      elem = mem();
      in_stack_ffffffffffffffb0 = local_10;
      std::unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>::
      unique_ptr((unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                  *)in_stack_ffffffffffffffb0,
                 (unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                  *)in_stack_ffffffffffffffa8);
      Stack<std::unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>_>
      ::push(this_00,(unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                      *)elem);
      std::unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>::
      ~unique_ptr((unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                   *)in_stack_ffffffffffffffb0);
    }
  }
  std::unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>::
  ~unique_ptr((unique_ptr<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
               *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }